

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall TypeTest_TestSubTypes_Test::TestBody(TypeTest_TestSubTypes_Test *this)

{
  ulong uVar1;
  undefined8 uVar2;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  undefined1 *puVar3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar4;
  mapped_type *pmVar5;
  __node_base_ptr p_Var6;
  char *pcVar7;
  char *in_R9;
  pointer *__ptr;
  undefined1 auVar8 [16];
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  Array AVar9;
  Array AVar10;
  initializer_list<wasm::Type> __l_01;
  Name name;
  undefined1 auStack_548 [8];
  Module wasm;
  variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  local_150;
  HeapType local_130;
  undefined1 auStack_128 [8];
  SubTypes subTypes;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> immSubTypes0;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> subTypes0;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> immSubTypes1;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  depths;
  TypeBuilder builder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  AssertHelper local_28;
  AssertHelper local_20;
  
  ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&depths._M_h._M_single_bucket,4);
  immSubTypes1.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x22;
  depths._M_h._M_buckets = (__buckets_ptr)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)
                 &immSubTypes1.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_128,__l,
             (allocator_type *)&local_150);
  auStack_548 = auStack_128;
  wasm.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_start;
  wasm.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  auStack_128 = (undefined1  [8])0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::wasm::TypeBuilder::setOpen((ulong)&depths._M_h._M_single_bucket,false);
  ::wasm::TypeBuilder::setHeapType((ulong)&depths._M_h._M_single_bucket,(Struct *)0x0);
  if (auStack_548 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_548,
                    (long)wasm.exports.
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_548);
  }
  if (auStack_128 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_128,
                    (long)subTypes.types.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_128);
  }
  immSubTypes1.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_0000002a;
  depths._M_h._M_buckets = (__buckets_ptr)0x0;
  __l_00._M_len = 1;
  __l_00._M_array =
       (iterator)
       &immSubTypes1.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_128,__l_00,
             (allocator_type *)&local_150);
  auStack_548 = auStack_128;
  wasm.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_start;
  wasm.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  auStack_128 = (undefined1  [8])0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::wasm::TypeBuilder::setOpen((ulong)&depths._M_h._M_single_bucket,true);
  ::wasm::TypeBuilder::setHeapType((ulong)&depths._M_h._M_single_bucket,(Struct *)0x1);
  if (auStack_548 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_548,
                    (long)wasm.exports.
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_548);
  }
  if (auStack_128 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_128,
                    (long)subTypes.types.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_128);
  }
  ::wasm::TypeBuilder::setOpen((ulong)&depths._M_h._M_single_bucket,true);
  ::wasm::TypeBuilder::setShared((ulong)&depths._M_h._M_single_bucket,2);
  auStack_548 = (undefined1  [8])0x26;
  wasm.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  AVar9.element._8_8_ = auStack_548;
  AVar9.element.type.id = 2;
  ::wasm::TypeBuilder::setHeapType((ulong)&depths._M_h._M_single_bucket,AVar9);
  ::wasm::TypeBuilder::setOpen((ulong)&depths._M_h._M_single_bucket,true);
  ::wasm::TypeBuilder::setShared((ulong)&depths._M_h._M_single_bucket,3);
  auStack_548 = (undefined1  [8])0x2e;
  wasm.exports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  AVar10.element._8_8_ = auStack_548;
  AVar10.element.type.id = 3;
  ::wasm::TypeBuilder::setHeapType((ulong)&depths._M_h._M_single_bucket,AVar10);
  uVar2 = ::wasm::TypeBuilder::getTempHeapType((ulong)&depths._M_h._M_single_bucket);
  ::wasm::TypeBuilder::setSubType(&depths._M_h._M_single_bucket,1,uVar2,1);
  uVar2 = ::wasm::TypeBuilder::getTempHeapType((ulong)&depths._M_h._M_single_bucket);
  ::wasm::TypeBuilder::setSubType(&depths._M_h._M_single_bucket,3,uVar2,1);
  ::wasm::TypeBuilder::build();
  auStack_128[0] =
       local_150.
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index
       == 0;
  subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_150.
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index
      != 0) {
    testing::Message::Message
              ((Message *)
               &immSubTypes1.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_548,(internal *)auStack_128,(AssertionResult *)"result","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &subTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x5d1,(char *)auStack_548);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &subTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (Message *)
               &immSubTypes1.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &subTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (auStack_548 !=
        (undefined1  [8])
        &wasm.exports.
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
      operator_delete((void *)auStack_548,
                      (ulong)((long)&((wasm.exports.
                                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                     super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                     .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 1)
                     );
    }
    if (immSubTypes1.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      (**(code **)((immSubTypes1.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->id + 8))();
    }
    if (subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&subTypes,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   subTypes.types.
                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                   super__Vector_impl_data._M_start);
    }
LAB_001ea9e0:
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr
      [local_150.
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index]
      ._M_data)((anon_class_1_0_00000001 *)auStack_548,&local_150);
    ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&depths._M_h._M_single_bucket);
    return;
  }
  __x = std::
        get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                  (&local_150);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &subTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__x);
  ::wasm::Module::Module((Module *)auStack_548);
  auVar8 = ::wasm::IString::interned(4,"func",0);
  ::wasm::HeapType::HeapType(&local_130,(Signature)ZEXT816(0));
  uVar1 = (subTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage)->id;
  auStack_128 = (undefined1  [8])(uVar1 | 2);
  if (((uint)(0x7c < uVar1) * 4 + 3 & (uint)uVar1) == 0) {
    uVar1 = subTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[1].id;
    subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(uVar1 | 2);
    if (((uint)(0x7c < uVar1) * 4 + 3 & (uint)uVar1) == 0) {
      uVar1 = subTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[2].id;
      subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar1 | 2);
      if (((uint)(0x7c < uVar1) * 4 + 3 & (uint)uVar1) == 0) {
        uVar1 = subTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage[3].id;
        subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(uVar1 | 2);
        if (((uint)(0x7c < uVar1) * 4 + 3 & (uint)uVar1) == 0) {
          __l_01._M_len = 4;
          __l_01._M_array = (iterator)auStack_128;
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                     &immSubTypes1.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,__l_01,
                     (allocator_type *)
                     &immSubTypes0.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          puVar3 = (undefined1 *)
                   MixedArena::allocSpace
                             ((MixedArena *)&wasm.typeIndices._M_h._M_single_bucket,0x10,8);
          *puVar3 = 0x16;
          *(undefined8 *)(puVar3 + 8) = 0;
          name.super_IString.str._M_str = auVar8._0_8_;
          name.super_IString.str._M_len = (size_t)&subTypes.typeSubTypes._M_h._M_single_bucket;
          ::wasm::Builder::makeFunction
                    (name,(HeapType)auVar8._8_8_,
                     (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_130.id,
                     (Expression *)
                     &immSubTypes1.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          ::wasm::Module::addFunction((unique_ptr *)auStack_548);
          if (subTypes.typeSubTypes._M_h._M_single_bucket != (__node_base_ptr)0x0) {
            std::default_delete<wasm::Function>::operator()
                      ((default_delete<wasm::Function> *)
                       &subTypes.typeSubTypes._M_h._M_single_bucket,
                       (Function *)subTypes.typeSubTypes._M_h._M_single_bucket);
          }
          subTypes.typeSubTypes._M_h._M_single_bucket = (__node_base_ptr)0x0;
          if (immSubTypes1.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            operator_delete(immSubTypes1.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                            depths._M_h._M_bucket_count -
                            (long)immSubTypes1.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          ::wasm::SubTypes::SubTypes((SubTypes *)auStack_128,(Module *)auStack_548);
          pvVar4 = ::wasm::SubTypes::getImmediateSubTypes
                             ((SubTypes *)auStack_128,
                              (HeapType)
                              (subTypes0.
                               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage)->id);
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                     &subTypes.typeSubTypes._M_h._M_single_bucket,pvVar4);
          immSubTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)immSubTypes0.
                               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                               _M_impl.super__Vector_impl_data._M_start -
                         (long)subTypes.typeSubTypes._M_h._M_single_bucket >> 3);
          built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)CONCAT44(built.
                                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,1);
          testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                    ((internal *)
                     &immSubTypes1.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,"immSubTypes0.size()","1u",
                     (unsigned_long *)
                     &immSubTypes0.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (uint *)&built.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          if ((char)immSubTypes1.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
            testing::Message::Message
                      ((Message *)
                       &immSubTypes0.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            if (depths._M_h._M_buckets == (__buckets_ptr)0x0) {
              p_Var6 = (__node_base_ptr)0x27a552;
            }
            else {
              p_Var6 = *depths._M_h._M_buckets;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)
                       &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                       ,0x5e1,(char *)p_Var6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)
                       &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (Message *)
                       &immSubTypes0.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)
                       &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            if (immSubTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              (**(code **)((immSubTypes0.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage)->id + 8))();
            }
            if (depths._M_h._M_buckets != (__buckets_ptr)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&depths,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           depths._M_h._M_buckets);
            }
          }
          else {
            if (depths._M_h._M_buckets != (__buckets_ptr)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&depths,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           depths._M_h._M_buckets);
            }
            testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
                      ((internal *)
                       &immSubTypes1.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,"immSubTypes0[0]","built[1]",
                       (HeapType *)subTypes.typeSubTypes._M_h._M_single_bucket,
                       subTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
            if ((char)immSubTypes1.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage == '\0') {
              testing::Message::Message
                        ((Message *)
                         &immSubTypes0.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              if (depths._M_h._M_buckets == (__buckets_ptr)0x0) {
                p_Var6 = (__node_base_ptr)0x27a552;
              }
              else {
                p_Var6 = *depths._M_h._M_buckets;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                         ,0x5e2,(char *)p_Var6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)
                         &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Message *)
                         &immSubTypes0.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              if (immSubTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                (**(code **)((immSubTypes0.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->id + 8))();
              }
            }
            if (depths._M_h._M_buckets != (__buckets_ptr)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&depths,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           depths._M_h._M_buckets);
            }
            ::wasm::SubTypes::getSubTypes
                      ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                       &immSubTypes0.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(SubTypes *)auStack_128,
                       (HeapType)
                       (subTypes0.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage)->id);
            built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)((long)subTypes0.
                                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                           (long)immSubTypes0.
                                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3);
            builder.impl._M_t.
            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl._0_4_ = 2;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                      ((internal *)
                       &immSubTypes1.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,"subTypes0.size()","2u",
                       (unsigned_long *)
                       &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(uint *)&builder);
            if ((char)immSubTypes1.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage == '\0') {
              testing::Message::Message
                        ((Message *)
                         &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              if (depths._M_h._M_buckets == (__buckets_ptr)0x0) {
                p_Var6 = (__node_base_ptr)0x27a552;
              }
              else {
                p_Var6 = *depths._M_h._M_buckets;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&builder,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                         ,0x5e4,(char *)p_Var6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&builder,
                         (Message *)
                         &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
              if (built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                (**(code **)((built.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->id + 8))();
              }
              if (depths._M_h._M_buckets != (__buckets_ptr)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&depths,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             depths._M_h._M_buckets);
              }
            }
            else {
              if (depths._M_h._M_buckets != (__buckets_ptr)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&depths,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             depths._M_h._M_buckets);
              }
              testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
                        ((internal *)
                         &immSubTypes1.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,"subTypes0[0]",
                         "built[1]",
                         immSubTypes0.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage,
                         subTypes0.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage + 1);
              if ((char)immSubTypes1.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage == '\0') {
                testing::Message::Message
                          ((Message *)
                           &built.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                if (depths._M_h._M_buckets == (__buckets_ptr)0x0) {
                  p_Var6 = (__node_base_ptr)0x27a552;
                }
                else {
                  p_Var6 = *depths._M_h._M_buckets;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&builder,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0x5e5,(char *)p_Var6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&builder,
                           (Message *)
                           &built.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
                if (built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  (**(code **)((built.
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)->id + 8))();
                }
              }
              if (depths._M_h._M_buckets != (__buckets_ptr)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&depths,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             depths._M_h._M_buckets);
              }
              testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
                        ((internal *)
                         &immSubTypes1.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,"subTypes0[1]",
                         "built[0]",
                         immSubTypes0.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage + 1,
                         subTypes0.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage);
              if ((char)immSubTypes1.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage == '\0') {
                testing::Message::Message
                          ((Message *)
                           &built.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                if (depths._M_h._M_buckets == (__buckets_ptr)0x0) {
                  p_Var6 = (__node_base_ptr)0x27a552;
                }
                else {
                  p_Var6 = *depths._M_h._M_buckets;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&builder,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0x5e6,(char *)p_Var6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&builder,
                           (Message *)
                           &built.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builder);
                if (built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  (**(code **)((built.
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)->id + 8))();
                }
              }
              if (depths._M_h._M_buckets != (__buckets_ptr)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&depths,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             depths._M_h._M_buckets);
              }
              pvVar4 = ::wasm::SubTypes::getImmediateSubTypes
                                 ((SubTypes *)auStack_128,
                                  (HeapType)
                                  subTypes0.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage[1].id);
              std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                        ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4);
              builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
                   (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                    )((long)immSubTypes1.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_start -
                      (long)built.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage >> 3);
              local_20.data_ = (AssertHelperData *)((ulong)local_20.data_._4_4_ << 0x20);
              testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                        ((internal *)
                         &immSubTypes1.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,"immSubTypes1.size()",
                         "0u",(unsigned_long *)&builder,(uint *)&local_20);
              if ((char)immSubTypes1.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage == '\0') {
                testing::Message::Message((Message *)&builder);
                if (depths._M_h._M_buckets == (__buckets_ptr)0x0) {
                  p_Var6 = (__node_base_ptr)0x27a552;
                }
                else {
                  p_Var6 = *depths._M_h._M_buckets;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_20,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0x5e8,(char *)p_Var6);
                testing::internal::AssertHelper::operator=(&local_20,(Message *)&builder);
                testing::internal::AssertHelper::~AssertHelper(&local_20);
                if (builder.impl._M_t.
                    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
                    (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
                     )0x0) {
                  (**(code **)(*(long *)builder.impl._M_t.
                                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                        _M_head_impl + 8))();
                }
              }
              if (depths._M_h._M_buckets != (__buckets_ptr)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&depths,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             depths._M_h._M_buckets);
              }
              ::wasm::SubTypes::getMaxDepths
                        ((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                          *)&immSubTypes1.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (SubTypes *)auStack_128);
              local_20.data_ = (AssertHelperData *)&DAT_00000020;
              pmVar5 = std::__detail::
                       _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&immSubTypes1.
                                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (key_type *)&local_20);
              local_28.data_._0_4_ = 4;
              testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                        ((internal *)&builder,"depths[HeapTypes::any.getBasic(Unshared)]","4u",
                         pmVar5,(uint *)&local_28);
              if ((char)builder.impl._M_t.
                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl ==
                  '\0') {
                testing::Message::Message((Message *)&local_20);
                if (local_30 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = (local_30->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_28,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0x5eb,pcVar7);
                testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
                testing::internal::AssertHelper::~AssertHelper(&local_28);
                if (local_20.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_20.data_ + 8))();
                }
              }
              if (local_30 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_30,local_30);
              }
              local_20.data_ = (AssertHelperData *)&DAT_00000024;
              pmVar5 = std::__detail::
                       _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&immSubTypes1.
                                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (key_type *)&local_20);
              local_28.data_._0_4_ = 4;
              testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                        ((internal *)&builder,"depths[HeapTypes::any.getBasic(Shared)]","4u",pmVar5,
                         (uint *)&local_28);
              if ((char)builder.impl._M_t.
                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl ==
                  '\0') {
                testing::Message::Message((Message *)&local_20);
                if (local_30 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = (local_30->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_28,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0x5ec,pcVar7);
                testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
                testing::internal::AssertHelper::~AssertHelper(&local_28);
                if (local_20.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_20.data_ + 8))();
                }
              }
              if (local_30 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_30,local_30);
              }
              local_20.data_ = (AssertHelperData *)&DAT_00000028;
              pmVar5 = std::__detail::
                       _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&immSubTypes1.
                                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (key_type *)&local_20);
              local_28.data_._0_4_ = 3;
              testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                        ((internal *)&builder,"depths[HeapTypes::eq.getBasic(Unshared)]","3u",pmVar5
                         ,(uint *)&local_28);
              if ((char)builder.impl._M_t.
                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl ==
                  '\0') {
                testing::Message::Message((Message *)&local_20);
                if (local_30 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = (local_30->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_28,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0x5ed,pcVar7);
                testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
                testing::internal::AssertHelper::~AssertHelper(&local_28);
                if (local_20.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_20.data_ + 8))();
                }
              }
              if (local_30 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_30,local_30);
              }
              local_20.data_ = (AssertHelperData *)&DAT_0000002c;
              pmVar5 = std::__detail::
                       _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&immSubTypes1.
                                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (key_type *)&local_20);
              local_28.data_._0_4_ = 3;
              testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                        ((internal *)&builder,"depths[HeapTypes::eq.getBasic(Shared)]","3u",pmVar5,
                         (uint *)&local_28);
              if ((char)builder.impl._M_t.
                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl ==
                  '\0') {
                testing::Message::Message((Message *)&local_20);
                if (local_30 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = (local_30->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_28,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0x5ee,pcVar7);
                testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
                testing::internal::AssertHelper::~AssertHelper(&local_28);
                if (local_20.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_20.data_ + 8))();
                }
              }
              if (local_30 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_30,local_30);
              }
              local_20.data_ = (AssertHelperData *)&DAT_00000038;
              pmVar5 = std::__detail::
                       _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&immSubTypes1.
                                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (key_type *)&local_20);
              local_28.data_._0_4_ = 2;
              testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                        ((internal *)&builder,"depths[HeapTypes::struct_.getBasic(Unshared)]","2u",
                         pmVar5,(uint *)&local_28);
              if ((char)builder.impl._M_t.
                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl ==
                  '\0') {
                testing::Message::Message((Message *)&local_20);
                if (local_30 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = (local_30->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_28,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0x5ef,pcVar7);
                testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
                testing::internal::AssertHelper::~AssertHelper(&local_28);
                if (local_20.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_20.data_ + 8))();
                }
              }
              if (local_30 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_30,local_30);
              }
              local_20.data_ = (AssertHelperData *)&DAT_0000003c;
              pmVar5 = std::__detail::
                       _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&immSubTypes1.
                                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (key_type *)&local_20);
              local_28.data_._0_4_ = 0;
              testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                        ((internal *)&builder,"depths[HeapTypes::struct_.getBasic(Shared)]","0u",
                         pmVar5,(uint *)&local_28);
              if ((char)builder.impl._M_t.
                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl ==
                  '\0') {
                testing::Message::Message((Message *)&local_20);
                if (local_30 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = (local_30->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_28,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0x5f0,pcVar7);
                testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
                testing::internal::AssertHelper::~AssertHelper(&local_28);
                if (local_20.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_20.data_ + 8))();
                }
              }
              if (local_30 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_30,local_30);
              }
              local_20.data_ = (AssertHelperData *)&DAT_00000040;
              pmVar5 = std::__detail::
                       _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&immSubTypes1.
                                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (key_type *)&local_20);
              local_28.data_._0_4_ = 0;
              testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                        ((internal *)&builder,"depths[HeapTypes::array.getBasic(Unshared)]","0u",
                         pmVar5,(uint *)&local_28);
              if ((char)builder.impl._M_t.
                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl ==
                  '\0') {
                testing::Message::Message((Message *)&local_20);
                if (local_30 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = (local_30->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_28,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0x5f1,pcVar7);
                testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
                testing::internal::AssertHelper::~AssertHelper(&local_28);
                if (local_20.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_20.data_ + 8))();
                }
              }
              if (local_30 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_30,local_30);
              }
              local_20.data_ = (AssertHelperData *)&DAT_00000044;
              pmVar5 = std::__detail::
                       _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&immSubTypes1.
                                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (key_type *)&local_20);
              local_28.data_._0_4_ = 2;
              testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                        ((internal *)&builder,"depths[HeapTypes::array.getBasic(Shared)]","2u",
                         pmVar5,(uint *)&local_28);
              if ((char)builder.impl._M_t.
                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl ==
                  '\0') {
                testing::Message::Message((Message *)&local_20);
                if (local_30 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = (local_30->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_28,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0x5f2,pcVar7);
                testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
                testing::internal::AssertHelper::~AssertHelper(&local_28);
                if (local_20.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_20.data_ + 8))();
                }
              }
              if (local_30 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_30,local_30);
              }
              pmVar5 = std::__detail::
                       _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&immSubTypes1.
                                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    subTypes0.
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_20.data_._0_4_ = 1;
              testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                        ((internal *)&builder,"depths[built[0]]","1u",pmVar5,(uint *)&local_20);
              if ((char)builder.impl._M_t.
                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl ==
                  '\0') {
                testing::Message::Message((Message *)&local_20);
                if (local_30 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = (local_30->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_28,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0x5f3,pcVar7);
                testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
                testing::internal::AssertHelper::~AssertHelper(&local_28);
                if (local_20.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_20.data_ + 8))();
                }
              }
              if (local_30 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_30,local_30);
              }
              pmVar5 = std::__detail::
                       _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&immSubTypes1.
                                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    subTypes0.
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              local_20.data_ = local_20.data_ & 0xffffffff00000000;
              testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                        ((internal *)&builder,"depths[built[1]]","0u",pmVar5,(uint *)&local_20);
              if ((char)builder.impl._M_t.
                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl ==
                  '\0') {
                testing::Message::Message((Message *)&local_20);
                if (local_30 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = (local_30->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_28,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0x5f4,pcVar7);
                testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
                testing::internal::AssertHelper::~AssertHelper(&local_28);
                if (local_20.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_20.data_ + 8))();
                }
              }
              if (local_30 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_30,local_30);
              }
              pmVar5 = std::__detail::
                       _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&immSubTypes1.
                                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    subTypes0.
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
              local_20.data_._0_4_ = 1;
              testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                        ((internal *)&builder,"depths[built[2]]","1u",pmVar5,(uint *)&local_20);
              if ((char)builder.impl._M_t.
                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl ==
                  '\0') {
                testing::Message::Message((Message *)&local_20);
                if (local_30 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = (local_30->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_28,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0x5f5,pcVar7);
                testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
                testing::internal::AssertHelper::~AssertHelper(&local_28);
                if (local_20.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_20.data_ + 8))();
                }
              }
              if (local_30 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_30,local_30);
              }
              pmVar5 = std::__detail::
                       _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&immSubTypes1.
                                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    subTypes0.
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
              local_20.data_ = local_20.data_ & 0xffffffff00000000;
              testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                        ((internal *)&builder,"depths[built[3]]","0u",pmVar5,(uint *)&local_20);
              if ((char)builder.impl._M_t.
                        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl ==
                  '\0') {
                testing::Message::Message((Message *)&local_20);
                if (local_30 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = (local_30->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_28,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                           ,0x5f6,pcVar7);
                testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
                testing::internal::AssertHelper::~AssertHelper(&local_28);
                if (local_20.data_ != (AssertHelperData *)0x0) {
                  (**(code **)(*(long *)local_20.data_ + 8))();
                }
              }
              if (local_30 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_30,local_30);
              }
              std::
              _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)&immSubTypes1.
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
              if (built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                operator_delete(built.
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (long)immSubTypes1.
                                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)built.
                                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
            }
            if (immSubTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              operator_delete(immSubTypes0.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (long)subTypes0.
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)immSubTypes0.
                                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
          }
          if (subTypes.typeSubTypes._M_h._M_single_bucket != (__node_base_ptr)0x0) {
            operator_delete(subTypes.typeSubTypes._M_h._M_single_bucket,
                            (long)immSubTypes0.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)subTypes.typeSubTypes._M_h._M_single_bucket);
          }
          std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&subTypes.types.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (auStack_128 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_128,
                            (long)subTypes.types.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_128);
          }
          ::wasm::Module::~Module((Module *)auStack_548);
          if (subTypes0.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            operator_delete(subTypes0.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (long)built.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)subTypes0.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          goto LAB_001ea9e0;
        }
      }
    }
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

TEST_F(TypeTest, TestSubTypes) {
  Type anyref = Type(HeapType::any, Nullable);
  Type eqref = Type(HeapType::eq, Nullable);
  Type sharedAnyref = Type(HeapTypes::any.getBasic(Shared), Nullable);
  Type sharedEqref = Type(HeapTypes::eq.getBasic(Shared), Nullable);

  // Build type types, the second of which is a subtype.
  TypeBuilder builder(4);
  builder[0].setOpen() = Struct({Field(anyref, Immutable)});
  builder[1].setOpen() = Struct({Field(eqref, Immutable)});
  // Make shared versions, too.
  builder[2].setOpen().setShared() = Array(Field(sharedAnyref, Immutable));
  builder[3].setOpen().setShared() = Array(Field(sharedEqref, Immutable));
  builder[1].subTypeOf(builder[0]);
  builder[3].subTypeOf(builder[2]);

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  // Build a tiny wasm module that uses the types, so that we can test the
  // SubTypes utility code.
  Module wasm;
  Builder wasmBuilder(wasm);
  wasm.addFunction(wasmBuilder.makeFunction("func",
                                            Signature(Type::none, Type::none),
                                            {Type(built[0], Nullable),
                                             Type(built[1], Nullable),
                                             Type(built[2], Nullable),
                                             Type(built[3], Nullable)},
                                            wasmBuilder.makeNop()));
  SubTypes subTypes(wasm);
  auto immSubTypes0 = subTypes.getImmediateSubTypes(built[0]);
  ASSERT_EQ(immSubTypes0.size(), 1u);
  EXPECT_EQ(immSubTypes0[0], built[1]);
  auto subTypes0 = subTypes.getSubTypes(built[0]);
  ASSERT_EQ(subTypes0.size(), 2u);
  EXPECT_EQ(subTypes0[0], built[1]);
  EXPECT_EQ(subTypes0[1], built[0]);
  auto immSubTypes1 = subTypes.getImmediateSubTypes(built[1]);
  EXPECT_EQ(immSubTypes1.size(), 0u);

  auto depths = subTypes.getMaxDepths();
  EXPECT_EQ(depths[HeapTypes::any.getBasic(Unshared)], 4u);
  EXPECT_EQ(depths[HeapTypes::any.getBasic(Shared)], 4u);
  EXPECT_EQ(depths[HeapTypes::eq.getBasic(Unshared)], 3u);
  EXPECT_EQ(depths[HeapTypes::eq.getBasic(Shared)], 3u);
  EXPECT_EQ(depths[HeapTypes::struct_.getBasic(Unshared)], 2u);
  EXPECT_EQ(depths[HeapTypes::struct_.getBasic(Shared)], 0u);
  EXPECT_EQ(depths[HeapTypes::array.getBasic(Unshared)], 0u);
  EXPECT_EQ(depths[HeapTypes::array.getBasic(Shared)], 2u);
  EXPECT_EQ(depths[built[0]], 1u);
  EXPECT_EQ(depths[built[1]], 0u);
  EXPECT_EQ(depths[built[2]], 1u);
  EXPECT_EQ(depths[built[3]], 0u);
}